

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_437549::ConvolveScale2DTest_DISABLED_Speed_Test::TestBody
          (ConvolveScale2DTest_DISABLED_Speed_Test *this)

{
  uint uVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  ParamType *pPVar5;
  long lVar6;
  int iVar7;
  aom_usec_timer timer;
  
  puVar3 = ConvolveScale2DTest::input(&this->super_ConvolveScale2DTest);
  puVar4 = ConvolveScale2DTest::output(&this->super_ConvolveScale2DTest);
  pPVar5 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_(*)[8],_int,_int,_int,_int,_int,_int)>_>
           ::GetParam();
  uVar1 = *(uint *)&(pPVar5->
                    super__Tuple_impl<0UL,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_(*)[8],_int,_int,_int,_int,_int,_int)>
                    ).
                    super__Tuple_impl<1UL,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_(*)[8],_int,_int,_int,_int,_int,_int)>
                    .field_0xc;
  pPVar5 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_(*)[8],_int,_int,_int,_int,_int,_int)>_>
           ::GetParam();
  uVar2 = (pPVar5->
          super__Tuple_impl<0UL,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_(*)[8],_int,_int,_int,_int,_int,_int)>
          ).
          super__Tuple_impl<1UL,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_(*)[8],_int,_int,_int,_int,_int,_int)>
          .super__Head_base<1UL,_int,_false>._M_head_impl;
  gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
  iVar7 = 10000;
  do {
    (*(this->super_ConvolveScale2DTest).test_func_)
              (puVar3,0x200,puVar4,0x200,av1_sub_pel_filters_8,8,0x10,8,0x10,uVar1,uVar2);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
  lVar6 = timer.end.tv_usec - timer.begin.tv_usec;
  iVar7 = (int)lVar6 + 1000000;
  if (-1 < lVar6) {
    iVar7 = (int)lVar6;
  }
  printf("convolve_scale_2d_%dx%d_%d: %d us\n",(ulong)uVar1,(ulong)uVar2,8,
         (ulong)(uint)(iVar7 + ((int)(lVar6 >> 0x3f) +
                               ((int)timer.end.tv_sec - (int)timer.begin.tv_sec)) * 1000000));
  return;
}

Assistant:

TEST_P(ConvolveScale2DTest, DISABLED_Speed) {
  const uint8_t *const in = input();
  uint8_t *const out = output();
  const InterpKernel *const filter =
      (const InterpKernel *)av1_get_interp_filter_kernel(EIGHTTAP_REGULAR,
                                                         USE_8_TAPS);
  const int kNumTests = 10000;
  const int width = Width();
  const int height = Height();
  const int frac = 8;
  const int step = 16;
  aom_usec_timer timer;

  aom_usec_timer_start(&timer);
  for (int n = 0; n < kNumTests; ++n) {
    test_func_(in, kInputStride, out, kOutputStride, filter, frac, step, frac,
               step, width, height);
  }
  aom_usec_timer_mark(&timer);

  const int elapsed_time = static_cast<int>(aom_usec_timer_elapsed(&timer));
  printf("convolve_scale_2d_%dx%d_%d: %d us\n", width, height, 8, elapsed_time);
}